

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsplitter.cpp
# Opt level: O1

void __thiscall QSplitterHandle::moveSplitter(QSplitterHandle *this,int pos)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  long lVar4;
  ulong uVar5;
  LayoutDirection LVar6;
  int index;
  ulong uVar7;
  ulong in_R8;
  bool bVar8;
  QRect QVar9;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  LVar6 = QWidget::layoutDirection(*(QWidget **)(lVar1 + 600));
  if ((LVar6 == RightToLeft) && (*(int *)(lVar1 + 0x260) == 1)) {
    QVar9 = QWidget::contentsRect(*(QWidget **)(lVar1 + 600));
    pos = (QVar9.x2.m_i.m_i - (QVar9.x1.m_i.m_i + pos)) + 1;
  }
  lVar2 = *(long *)&((*(QSplitter **)(lVar1 + 600))->super_QFrame).super_QWidget.field_0x8;
  uVar3 = *(ulong *)(lVar2 + 0x298);
  index = -1;
  if (uVar3 != 0) {
    uVar7 = 0;
    do {
      lVar4 = *(long *)(*(long *)(lVar2 + 0x290) + uVar7 * 8);
      if (*(QSplitterHandle **)(lVar4 + 0x18) == this) {
        bVar8 = false;
        uVar5 = uVar7;
      }
      else {
        bVar8 = *(QSplitterHandle **)(lVar4 + 0x20) != this;
        uVar5 = in_R8;
        if (!bVar8) {
          uVar5 = uVar7;
        }
      }
      in_R8 = uVar5 & 0xffffffff;
      if (!bVar8) {
        index = (int)uVar5;
        break;
      }
      uVar7 = uVar7 + 1;
    } while (uVar3 != uVar7);
  }
  QSplitter::moveSplitter(*(QSplitter **)(lVar1 + 600),pos,index);
  return;
}

Assistant:

void QSplitterHandle::moveSplitter(int pos)
{
    Q_D(QSplitterHandle);
    if (d->s->isRightToLeft() && d->orient == Qt::Horizontal)
        pos = d->s->contentsRect().width() - pos;
    d->s->moveSplitter(pos, d->s->indexOf(this));
}